

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O2

int main(void)

{
  server_t s;
  allocator<char> local_35a;
  allocator<char> local_359;
  string local_358;
  string local_338;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  server_t local_2f0;
  
  clask::server_t::server_t(&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"/api",(allocator<char> *)&local_338);
  local_318._M_unused._M_object = (void *)0x0;
  local_318._8_8_ = 0;
  local_300 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/json/main.cxx:7:17)>
              ::_M_invoke;
  local_308 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/json/main.cxx:7:17)>
              ::_M_manager;
  clask::server_t::GET(&local_2f0,&local_358,(functor_string *)&local_318);
  std::_Function_base::~_Function_base((_Function_base *)&local_318);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"/",&local_359);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"./public",&local_35a);
  clask::server_t::static_dir(&local_2f0,&local_358,&local_338,false);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  clask::server_t::run(&local_2f0,0x1f90);
  clask::server_t::~server_t(&local_2f0);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();

  s.GET("/api", [&](clask::request&) {
      nlohmann::json data;
      data["user"][0]["id"] = 1;
      data["user"][0]["name"] = "mattn";
      data["user"][0]["created_at"] = "2020/06/14 00:41:35";
      data["user"][1]["id"] = 2;
      data["user"][1]["name"] = "gopher";
      data["user"][1]["created_at"] = "2020/06/12 15:07:54";
      return data.dump();
  });
  s.static_dir("/", "./public");
  s.run();
}